

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

bool __thiscall
CorUnix::CSynchData::CanWaiterWaitWithoutBlocking
          (CSynchData *this,CPalThread *pWaiterThread,bool *pfAbandoned)

{
  LONG LVar1;
  bool bVar2;
  bool bVar3;
  
  LVar1 = GetSignalCount(this);
  if (LVar1 < 1) {
    bVar2 = false;
    bVar3 = false;
    if (CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics !=
        OwnershipTracked) goto LAB_0014e4f1;
    LVar1 = GetSignalCount(this);
    if ((LVar1 < 1) && (this->m_lOwnershipCount < 1)) {
      fprintf(_stderr,"] %s %s:%d","CanWaiterWaitWithoutBlocking",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x3ca);
      fprintf(_stderr,
              "Expression: 0 < GetSignalCount() || 0 < GetOwnershipCount(), Description: Objects with ownership must be either signaled or owned by a thread\n"
             );
    }
    bVar2 = false;
    bVar3 = false;
    if (this->m_dwOwnerPid != gPID) goto LAB_0014e4f1;
    bVar3 = this->m_pOwnerThread == pWaiterThread;
  }
  else {
    bVar3 = true;
    if (CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics ==
        OwnershipTracked) {
      bVar2 = this->m_fAbandoned;
      goto LAB_0014e4f1;
    }
  }
  bVar2 = false;
LAB_0014e4f1:
  *pfAbandoned = bVar2;
  return bVar3;
}

Assistant:

bool CSynchData::CanWaiterWaitWithoutBlocking(
        CPalThread * pWaiterThread,
        bool * pfAbandoned)
    {
        VALIDATEOBJECT(this);
        
        bool fRetVal = (0 < GetSignalCount());
        bool fAbandoned = false;
        bool fOwnershipTracked = (CObjectType::OwnershipTracked == 
                                  GetObjectType()->GetOwnershipSemantics());
        if (fRetVal)            
        {
            // Object signaled: thread can wait without blocking
            if (fOwnershipTracked)
            {
                fAbandoned = IsAbandoned();
            }

            goto CWWWB_exit;
        }

        // Object not signaled: thread can wait without blocking only if the
        // object is an ownable one, and it is owned by the current thread
        if (fOwnershipTracked)
        {
            _ASSERT_MSG(0 < GetSignalCount() || 0 < GetOwnershipCount(),
                        "Objects with ownership must be either signaled or "
                        "owned by a thread\n");
                        
            if ((GetOwnerProcessID() == gPID) && 
                (GetOwnerThread() == pWaiterThread) )
            {
                fRetVal = true;
                goto CWWWB_exit;
            }
        }

    CWWWB_exit:
        *pfAbandoned = fAbandoned;
        return fRetVal;
    }